

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

void Curl_bufq_skip(bufq *q,size_t amount)

{
  buf_chunk *pbVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (amount != 0) {
    do {
      pbVar1 = q->head;
      if (pbVar1 == (buf_chunk *)0x0) {
        return;
      }
      uVar3 = pbVar1->w_offset - pbVar1->r_offset;
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        if (amount <= uVar3) {
          uVar3 = amount;
        }
        sVar2 = pbVar1->r_offset + uVar3;
        pbVar1->r_offset = sVar2;
        if (sVar2 == pbVar1->w_offset) {
          pbVar1->r_offset = 0;
          pbVar1->w_offset = 0;
        }
      }
      prune_head(q);
      amount = amount - uVar3;
    } while (amount != 0);
  }
  return;
}

Assistant:

void Curl_bufq_skip(struct bufq *q, size_t amount)
{
  size_t n;

  while(amount && q->head) {
    n = chunk_skip(q->head, amount);
    amount -= n;
    prune_head(q);
  }
}